

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  parasail_result_t *ppVar18;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar20;
  longlong *plVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  longlong *plVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  long lVar37;
  ulong uVar38;
  __m128i *ptr_02;
  ulong size;
  long lVar39;
  undefined4 uVar40;
  longlong lVar41;
  undefined4 uVar57;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar65;
  undefined1 auVar66 [16];
  __m128i_64_t A;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t B_5;
  undefined1 auVar69 [16];
  __m128i_64_t B_2;
  long lVar72;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar73;
  __m128i_64_t B;
  long lVar75;
  undefined1 auVar74 [16];
  long lVar76;
  __m128i_64_t B_3;
  long lVar78;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  ulong local_c8;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong alStack_40 [2];
  int64_t iVar58;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar31 = (ulong)(uint)s2Len;
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_striped_profile_sse41_128_64_cold_1();
        }
        else {
          uVar15 = uVar3 - 1;
          uVar1 = (ulong)uVar3 + 1;
          size = uVar1 >> 1;
          uVar8 = (ulong)uVar15 % size;
          iVar25 = (int)(uVar15 / size);
          uVar32 = (ulong)(uint)open;
          iVar24 = -open;
          iVar33 = ppVar5->min;
          uVar38 = 0x8000000000000000 - (long)iVar33;
          if (iVar33 != iVar24 && SBORROW4(iVar33,iVar24) == iVar33 + open < 0) {
            uVar38 = uVar32 | 0x8000000000000000;
          }
          iVar33 = ppVar5->max;
          ppVar18 = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
          if (ppVar18 != (parasail_result_t *)0x0) {
            ppVar18->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar18->flag | 0x2820802;
            palVar19 = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
            if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && palVar19 != (__m128i *)0x0)) {
              iVar16 = s2Len + -1;
              local_c8 = uVar38 + 1;
              lVar30 = 0x7ffffffffffffffe - (long)iVar33;
              uVar40 = (undefined4)local_c8;
              uVar57 = (undefined4)(local_c8 >> 0x20);
              uVar65 = (undefined4)((ulong)lVar30 >> 0x20);
              auVar62._8_4_ = (int)lVar30;
              auVar62._0_8_ = lVar30;
              auVar62._12_4_ = uVar65;
              lVar20 = (long)iVar24;
              uVar35 = 0;
              do {
                lVar39 = 0;
                plVar21 = &local_58;
                plVar26 = &local_48;
                bVar13 = true;
                do {
                  bVar36 = bVar13;
                  if (s1_beg == 0) {
                    lVar39 = lVar20 - (lVar39 * size + uVar35) * (ulong)(uint)gap;
                  }
                  else {
                    lVar39 = 0;
                  }
                  *plVar26 = lVar39;
                  *plVar21 = lVar39 - uVar32;
                  lVar39 = 1;
                  plVar21 = &lStack_50;
                  plVar26 = alStack_40;
                  bVar13 = false;
                } while (bVar36);
                palVar19[uVar35][0] = local_48;
                palVar19[uVar35][1] = alStack_40[0];
                ptr_00[uVar35][0] = local_58;
                ptr_00[uVar35][1] = lStack_50;
                uVar35 = uVar35 + 1;
              } while (uVar35 != size);
              *ptr_01 = 0;
              auVar69 = _DAT_00906ca0;
              lVar39 = uVar31 - 1;
              auVar42._8_4_ = (int)lVar39;
              auVar42._0_8_ = lVar39;
              auVar42._12_4_ = (int)((ulong)lVar39 >> 0x20);
              auVar59 = pmovsxbq(in_XMM1,0x100);
              auVar42 = auVar42 ^ _DAT_00906ca0;
              uVar35 = 0;
              do {
                if ((bool)(~(auVar42._0_8_ < (long)(uVar35 ^ auVar69._0_8_)) & 1)) {
                  iVar33 = 0;
                  if (s2_beg == 0) {
                    iVar33 = iVar24;
                  }
                  ptr_01[uVar35 + 1] = (long)iVar33;
                }
                auVar67._8_4_ = (int)uVar35;
                auVar67._0_8_ = uVar35;
                auVar67._12_4_ = (int)(uVar35 >> 0x20);
                if ((long)((auVar67._8_8_ | auVar59._8_8_) ^ auVar69._8_8_) <= auVar42._8_8_) {
                  iVar33 = iVar24 - gap;
                  if (s2_beg != 0) {
                    iVar33 = 0;
                  }
                  ptr_01[uVar35 + 2] = (long)iVar33;
                }
                uVar35 = uVar35 + 2;
                iVar24 = iVar24 + gap * -2;
              } while ((s2Len + 1U & 0xfffffffe) != uVar35);
              uVar10 = (uint)size;
              lVar37 = size * uVar31 * 4;
              lVar39 = 0;
              uVar35 = 0;
              auVar69._8_4_ = uVar40;
              auVar69._0_8_ = local_c8;
              auVar69._12_4_ = uVar57;
              auVar59._8_4_ = uVar40;
              auVar59._0_8_ = local_c8;
              auVar59._12_4_ = uVar57;
              iVar33 = iVar16;
              do {
                ptr_02 = ptr;
                ptr = palVar19;
                palVar19 = ptr + (uVar10 - 1);
                auVar60._8_4_ = (int)(*palVar19)[0];
                auVar60._0_8_ = (*palVar19)[0];
                auVar60._12_4_ = *(undefined4 *)((long)*palVar19 + 4);
                iVar24 = ppVar5->mapper[(byte)s2[uVar35]];
                iVar58 = ptr_01[uVar35];
                lVar28 = auVar60._8_8_;
                lVar22 = 0;
                auVar70._8_4_ = uVar40;
                auVar70._0_8_ = local_c8;
                auVar70._12_4_ = uVar57;
                lVar27 = lVar39;
                do {
                  plVar2 = (long *)((long)pvVar4 + lVar22 + (long)iVar24 * (long)(int)uVar10 * 0x10)
                  ;
                  auVar61._0_8_ = iVar58 + *plVar2;
                  auVar61._8_8_ = lVar28 + plVar2[1];
                  auVar42 = *(undefined1 (*) [16])((long)*ptr_00 + lVar22);
                  lVar73 = auVar42._0_8_;
                  auVar43._0_8_ = -(ulong)(lVar73 < auVar61._0_8_);
                  lVar75 = auVar42._8_8_;
                  auVar43._8_8_ = -(ulong)(lVar75 < auVar61._8_8_);
                  auVar67 = blendvpd(auVar42,auVar61,auVar43);
                  lVar28 = auVar70._0_8_;
                  auVar44._0_8_ = -(ulong)(lVar28 < auVar67._0_8_);
                  lVar72 = auVar70._8_8_;
                  auVar44._8_8_ = -(ulong)(lVar72 < auVar67._8_8_);
                  auVar67 = blendvpd(auVar70,auVar67,auVar44);
                  lVar76 = auVar67._0_8_;
                  auVar45._0_8_ = -(ulong)(lVar76 < auVar59._0_8_);
                  lVar78 = auVar67._8_8_;
                  auVar45._8_8_ = -(ulong)(lVar78 < auVar59._8_8_);
                  auVar59 = blendvpd(auVar67,auVar59,auVar45);
                  auVar46._0_8_ = -(ulong)(auVar62._0_8_ < lVar76);
                  auVar46._8_8_ = -(ulong)(auVar62._8_8_ < lVar78);
                  auVar62 = blendvpd(auVar67,auVar62,auVar46);
                  auVar47._0_8_ = -(ulong)(auVar62._0_8_ < lVar73);
                  auVar47._8_8_ = -(ulong)(auVar62._8_8_ < lVar75);
                  auVar62 = blendvpd(auVar42,auVar62,auVar47);
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar22) = auVar67;
                  auVar48._0_8_ = -(ulong)(auVar62._0_8_ < lVar28);
                  auVar48._8_8_ = -(ulong)(auVar62._8_8_ < lVar72);
                  auVar62 = blendvpd(auVar70,auVar62,auVar48);
                  piVar6 = ((ppVar18->field_4).rowcols)->score_row;
                  *(int *)((long)piVar6 + lVar27) = auVar67._0_4_;
                  *(int *)((long)piVar6 + lVar37 + lVar27) = auVar67._8_4_;
                  auVar77._0_8_ = lVar76 - (ulong)(uint)open;
                  auVar77._8_8_ = lVar78 - (ulong)(uint)open;
                  auVar74._0_8_ = lVar73 - (ulong)(uint)gap;
                  auVar74._8_8_ = lVar75 - (ulong)(uint)gap;
                  auVar49._0_8_ = -(ulong)(auVar77._0_8_ < auVar74._0_8_);
                  auVar49._8_8_ = -(ulong)(auVar77._8_8_ < auVar74._8_8_);
                  auVar79._0_8_ = lVar28 - (ulong)(uint)gap;
                  auVar79._8_8_ = lVar72 - (ulong)(uint)gap;
                  auVar63._0_8_ = -(ulong)(auVar77._0_8_ < auVar79._0_8_);
                  auVar63._8_8_ = -(ulong)(auVar77._8_8_ < auVar79._8_8_);
                  auVar42 = blendvpd(auVar77,auVar74,auVar49);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar22) = auVar42;
                  auVar70 = blendvpd(auVar77,auVar79,auVar63);
                  plVar2 = (long *)((long)*ptr + lVar22);
                  iVar58 = *plVar2;
                  lVar28 = plVar2[1];
                  lVar22 = lVar22 + 0x10;
                  lVar27 = lVar27 + uVar31 * 4;
                } while (size << 4 != lVar22);
                bVar13 = true;
                do {
                  bVar36 = bVar13;
                  lVar28 = lVar20;
                  if (s2_beg == 0) {
                    lVar28 = ptr_01[uVar35 + 1] - uVar32;
                  }
                  auVar71._0_8_ = auVar70._0_8_;
                  auVar71._8_4_ = auVar70._0_4_;
                  auVar71._12_4_ = auVar70._4_4_;
                  auVar70._8_8_ = auVar71._8_8_;
                  auVar70._0_8_ = lVar28;
                  lVar27 = 0;
                  lVar28 = lVar39;
                  do {
                    auVar42 = *(undefined1 (*) [16])((long)*ptr_02 + lVar27);
                    auVar50._0_8_ = -(ulong)(auVar70._0_8_ < auVar42._0_8_);
                    lVar72 = auVar70._8_8_;
                    auVar50._8_8_ = -(ulong)(lVar72 < auVar42._8_8_);
                    auVar42 = blendvpd(auVar70,auVar42,auVar50);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar27) = auVar42;
                    lVar73 = auVar42._0_8_;
                    lVar75 = auVar42._8_8_;
                    auVar51._0_8_ = -(ulong)(auVar62._0_8_ < lVar73);
                    auVar51._8_8_ = -(ulong)(auVar62._8_8_ < lVar75);
                    auVar62 = blendvpd(auVar42,auVar62,auVar51);
                    piVar6 = ((ppVar18->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar28) = auVar42._0_4_;
                    lVar22 = (long)piVar6 + lVar28;
                    uVar7 = extractps(auVar42,2);
                    *(undefined8 *)(lVar37 + lVar22) = uVar7;
                    auVar52._0_8_ = -(ulong)(lVar73 < auVar59._0_8_);
                    auVar52._8_8_ = -(ulong)(lVar75 < auVar59._8_8_);
                    auVar59 = blendvpd(auVar42,auVar59,auVar52);
                    auVar70._0_8_ = auVar70._0_8_ - (ulong)(uint)gap;
                    auVar70._8_8_ = lVar72 - (ulong)(uint)gap;
                    auVar53._0_8_ = -(ulong)((long)(lVar73 - (ulong)(uint)open) < auVar70._0_8_);
                    auVar53._8_8_ = -(ulong)((long)(lVar75 - (ulong)(uint)open) < auVar70._8_8_);
                    iVar24 = movmskpd((int)lVar22,auVar53);
                    if (iVar24 == 0) goto LAB_006c4453;
                    lVar27 = lVar27 + 0x10;
                    lVar28 = lVar28 + uVar31 * 4;
                  } while (size << 4 != lVar27);
                  bVar13 = false;
                } while (bVar36);
LAB_006c4453:
                uVar29 = ptr_02[uVar8][1];
                lVar27 = auVar69._0_8_;
                lVar28 = lVar27;
                if (lVar27 < ptr_02[uVar8][0]) {
                  lVar28 = ptr_02[uVar8][0];
                }
                uVar23 = auVar69._8_8_;
                auVar54._0_8_ = -(ulong)(lVar27 < ptr_02[uVar8][0]);
                auVar54._8_8_ = -(ulong)((long)uVar23 < ptr_02[uVar8][1]);
                if ((long)uVar23 < (long)uVar29) {
                  uVar23 = uVar29;
                }
                auVar9._8_4_ = (int)-(ulong)(iVar25 == 1);
                auVar9._0_8_ = -(ulong)(iVar25 == 0);
                auVar9._12_4_ = (int)(-(ulong)(iVar25 == 1) >> 0x20);
                auVar69._8_8_ = uVar23;
                auVar69._0_8_ = lVar28;
                iVar24 = movmskpd((int)uVar23,auVar54 & auVar9);
                if (iVar24 != 0) {
                  iVar33 = (int)uVar35;
                }
                uVar35 = uVar35 + 1;
                lVar39 = lVar39 + 4;
                palVar19 = ptr_02;
                if (uVar35 == uVar31) {
                  if ((s2_end != 0) && (local_c8 = uVar23, iVar25 < 1)) {
                    do {
                      local_c8 = auVar69._0_8_;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = local_c8;
                      auVar69 = auVar11 << 0x40;
                    } while (iVar25 < 0);
                  }
                  uVar17 = uVar15;
                  if ((s1_end != 0) && ((uVar1 & 0x7ffffffe) != 0)) {
                    uVar12 = (uVar10 & 0x3fffffff) * 2;
                    uVar29 = (ulong)uVar12;
                    uVar31 = 0;
                    do {
                      uVar34 = 0;
                      if ((uVar31 & 1) != 0) {
                        uVar34 = uVar10;
                      }
                      uVar34 = uVar34 + ((uint)(uVar31 >> 1) & 0x7fffffff);
                      iVar24 = iVar33;
                      uVar14 = uVar17;
                      uVar1 = local_c8;
                      if (((int)uVar34 < (int)uVar3) &&
                         (uVar32 = (*ptr_02)[uVar31], iVar24 = iVar16, uVar14 = uVar34,
                         uVar1 = uVar32, (long)uVar32 <= (long)local_c8)) {
                        if ((int)uVar17 <= (int)uVar34) {
                          uVar34 = uVar17;
                        }
                        if (iVar33 != iVar16) {
                          uVar34 = uVar17;
                        }
                        iVar24 = iVar33;
                        uVar14 = uVar17;
                        uVar1 = local_c8;
                        if (uVar32 == local_c8) {
                          uVar14 = uVar34;
                        }
                      }
                      local_c8 = uVar1;
                      uVar17 = uVar14;
                      iVar33 = iVar24;
                      uVar31 = uVar31 + 1;
                    } while (uVar12 != (uint)uVar31);
                  }
                  iVar24 = (int)local_c8;
                  if (s2_end == 0 && s1_end == 0) {
                    lVar41 = ptr_02[uVar8][0];
                    iVar24 = (int)ptr_02[uVar8][1];
                    iVar33 = iVar16;
                    uVar17 = uVar15;
                    if (iVar25 < 1) {
                      do {
                        iVar24 = (int)lVar41;
                        lVar41 = 0;
                      } while (iVar25 < 0);
                    }
                  }
                  auVar55._8_4_ = (int)uVar38;
                  auVar55._0_8_ = uVar38;
                  auVar55._12_4_ = (int)(uVar38 >> 0x20);
                  auVar66._0_8_ = -(ulong)((long)uVar38 < auVar62._0_8_);
                  auVar66._8_8_ = -(ulong)(auVar55._8_8_ < auVar62._8_8_);
                  auVar56._8_4_ = 0xffffffff;
                  auVar56._0_8_ = 0xffffffffffffffff;
                  auVar56._12_4_ = 0xffffffff;
                  auVar64._8_4_ = (int)lVar30;
                  auVar64._0_8_ = lVar30;
                  auVar64._12_4_ = uVar65;
                  auVar68._0_8_ = -(ulong)(lVar30 < auVar59._0_8_);
                  auVar68._8_8_ = -(ulong)(auVar64._8_8_ < auVar59._8_8_);
                  iVar25 = movmskpd((int)uVar29,auVar68 | auVar56 ^ auVar66);
                  if (iVar25 != 0) {
                    *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                    iVar24 = 0;
                    iVar33 = 0;
                    uVar17 = 0;
                  }
                  ppVar18->score = iVar24;
                  ppVar18->end_query = uVar17;
                  ppVar18->end_ref = iVar33;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar18;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}